

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yoml-parser.h
# Opt level: O2

yoml_t_conflict *
yoml__parse_node(yaml_parser_t *parser,yaml_event_type_t *unhandled,yoml_parse_args_t *parse_args)

{
  size_t sVar1;
  _func_void_ptr_void_ptr_int_size_t *p_Var2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  yoml_t_conflict *node;
  yoml_t_conflict *pyVar6;
  yoml_t_conflict *pyVar7;
  long lVar8;
  yaml_event_type_t local_9c;
  yaml_event_t event;
  
  if (unhandled != (yaml_event_type_t *)0x0) {
    *unhandled = YAML_NO_EVENT;
  }
  while( true ) {
    iVar3 = yaml_parser_parse(parser,&event);
    if (iVar3 == 0) {
      return (yoml_t_conflict *)0x0;
    }
    if ((event.type & ~YAML_STREAM_END_EVENT) != YAML_STREAM_START_EVENT) break;
    yaml_event_delete(&event);
  }
  switch(event.type) {
  case YAML_ALIAS_EVENT:
    node = yoml__new_node(parse_args->filename,YOML__TYPE_UNRESOLVED_ALIAS,0x50,(yaml_char_t *)0x0,
                          (yaml_char_t *)0x0,&event);
    pcVar4 = strdup((char *)event.data.scalar.anchor);
    (node->data).scalar = pcVar4;
    goto LAB_0018a29d;
  case YAML_SCALAR_EVENT:
    node = yoml__new_node(parse_args->filename,YOML_TYPE_SCALAR,0x50,event.data.scalar.anchor,
                          event.data.scalar.tag,&event);
    pcVar4 = strdup((char *)event.data.scalar.value);
    (node->data).scalar = pcVar4;
    p_Var2 = parse_args->mem_set;
    if (p_Var2 != (_func_void_ptr_void_ptr_int_size_t *)0x0) {
      sVar5 = strlen(pcVar4);
      (*p_Var2)(event.data.document_start.tag_directives.end,0x41,sVar5);
    }
    goto LAB_0018a29d;
  case YAML_SEQUENCE_START_EVENT:
    node = yoml__new_node(parse_args->filename,YOML_TYPE_SEQUENCE,0x40,event.data.scalar.anchor,
                          event.data.scalar.tag,&event);
    (node->data).scalar = (char *)0x0;
    while (pyVar6 = yoml__parse_node(parser,&local_9c,parse_args), pyVar6 != (yoml_t_conflict *)0x0)
    {
      node = (yoml_t_conflict *)realloc(node,(node->data).sequence.size * 8 + 0x48);
      sVar1 = (node->data).sequence.size;
      (node->data).scalar = (char *)(sVar1 + 1);
      *(yoml_t_conflict **)((long)&node->data + sVar1 * 8 + 8) = pyVar6;
    }
    if (local_9c == YAML_SEQUENCE_END_EVENT) goto LAB_0018a29d;
    break;
  default:
    if (unhandled != (yaml_event_type_t *)0x0) {
      *unhandled = event.type;
    }
    goto LAB_0018a29a;
  case YAML_MAPPING_START_EVENT:
    node = yoml__new_node(parse_args->filename,YOML_TYPE_MAPPING,0x40,event.data.scalar.anchor,
                          event.data.scalar.tag,&event);
    (node->data).scalar = (char *)0x0;
    while (pyVar6 = yoml__parse_node(parser,&local_9c,parse_args), pyVar6 != (yoml_t_conflict *)0x0)
    {
      pyVar7 = yoml__parse_node(parser,(yaml_event_type_t *)0x0,parse_args);
      if (pyVar7 == (yoml_t_conflict *)0x0) goto LAB_0018a28e;
      node = (yoml_t_conflict *)realloc(node,(node->data).sequence.size * 0x10 + 0x50);
      lVar8 = (node->data).sequence.size * 0x10;
      *(yoml_t_conflict **)((long)&node->data + lVar8 + 8) = pyVar6;
      *(yoml_t_conflict **)((long)&node->data + lVar8 + 0x10) = pyVar7;
      (node->data).scalar = (char *)((node->data).sequence.size + 1);
    }
    if (local_9c == YAML_MAPPING_END_EVENT) goto LAB_0018a29d;
  }
LAB_0018a28e:
  yoml_free(node,parse_args->mem_set);
LAB_0018a29a:
  node = (yoml_t_conflict *)0x0;
LAB_0018a29d:
  yaml_event_delete(&event);
  return node;
}

Assistant:

static yoml_t *yoml__parse_node(yaml_parser_t *parser, yaml_event_type_t *unhandled, yoml_parse_args_t *parse_args)
{
    yoml_t *node;
    yaml_event_t event;

    if (unhandled != NULL)
        *unhandled = YAML_NO_EVENT;

    /* wait for a node that is not a stream/doc start event */
    while (1) {
        if (!yaml_parser_parse(parser, &event))
            return NULL;
        if (!(event.type == YAML_STREAM_START_EVENT || event.type == YAML_DOCUMENT_START_EVENT))
            break;
        yaml_event_delete(&event);
    }

    switch (event.type) {
    case YAML_ALIAS_EVENT:
        node = yoml__new_node(parse_args->filename, YOML__TYPE_UNRESOLVED_ALIAS, sizeof(*node), NULL, NULL, &event);
        node->data.alias = yoml__strdup(event.data.alias.anchor);
        break;
    case YAML_SCALAR_EVENT:
        node = yoml__new_node(parse_args->filename, YOML_TYPE_SCALAR, sizeof(*node), event.data.scalar.anchor, event.data.scalar.tag, &event);
        node->data.scalar = yoml__strdup(event.data.scalar.value);
        if (parse_args->mem_set != NULL)
            parse_args->mem_set(event.data.scalar.value, 'A', strlen(node->data.scalar));
        break;
    case YAML_SEQUENCE_START_EVENT:
        node = yoml__parse_sequence(parser, &event, parse_args);
        break;
    case YAML_MAPPING_START_EVENT:
        node = yoml__parse_mapping(parser, &event, parse_args);
        break;
    default:
        node = NULL;
        if (unhandled != NULL)
            *unhandled = event.type;
        break;
    }

    yaml_event_delete(&event);

    return node;
}